

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1072::run(TestCase1072 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  BuilderArena *__s;
  BuilderArena *pBVar3;
  uint i;
  long lVar4;
  Builder BVar5;
  Reader RVar6;
  undefined1 local_178 [16];
  BuilderArena *local_168;
  Orphan<capnp::Data> orphan2;
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  orphan2.builder._0_16_ = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  Orphanage::newOrphan<capnp::Data>(&orphan,(Orphanage *)&orphan2,0x11);
  BVar5 = OrphanBuilder::asData(&orphan.builder);
  __s = (BuilderArena *)BVar5.super_ArrayPtr<unsigned_char>.ptr;
  memset(__s,0x7b,BVar5.super_ArrayPtr<unsigned_char>.size_);
  local_178 = (undefined1  [16])MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  Orphanage::newOrphan<capnp::Data>(&orphan2,(Orphanage *)local_178,1);
  BVar5 = OrphanBuilder::asData(&orphan2.builder);
  *BVar5.super_ArrayPtr<unsigned_char>.ptr = ' ';
  Orphan<capnp::Data>::truncate(&orphan,(char *)0x1b,BVar5.super_ArrayPtr<unsigned_char>.size_);
  RVar6 = OrphanBuilder::asDataReader(&orphan.builder);
  pBVar3 = (BuilderArena *)RVar6.super_ArrayPtr<const_unsigned_char>.ptr;
  if ((BuilderArena *)RVar6.super_ArrayPtr<const_unsigned_char>.size_ != (BuilderArena *)0x1b &&
      kj::_::Debug::minSeverity < 3) {
    local_168 = (BuilderArena *)CONCAT44(local_168._4_4_,0x1b);
    local_178._0_8_ = (BuilderArena *)RVar6.super_ArrayPtr<const_unsigned_char>.size_;
    kj::_::Debug::log<char_const(&)[41],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x43c,ERROR,"\"failed: expected \" \"(27) == (reader.size())\", 27, reader.size()",
               (char (*) [41])"failed: expected (27) == (reader.size())",(int *)&local_168,
               (unsigned_long *)local_178);
  }
  if ((__s == pBVar3) && (kj::_::Debug::minSeverity < 3)) {
    local_178._0_8_ = __s;
    local_168 = pBVar3;
    kj::_::Debug::log<char_const(&)[55],unsigned_char*,unsigned_char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x43d,ERROR,
               "\"failed: expected \" \"(builder.begin()) != (reader.begin())\", builder.begin(), reader.begin()"
               ,(char (*) [55])"failed: expected (builder.begin()) != (reader.begin())",
               (uchar **)local_178,(uchar **)&local_168);
  }
  for (lVar4 = 0; lVar4 != 0x11; lVar4 = lVar4 + 1) {
    if (kj::_::Debug::minSeverity < 3 &&
        *(uchar *)((long)&(pBVar3->super_Arena)._vptr_Arena + lVar4) != '{') {
      local_178._0_4_ = 0x7b;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char_const&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x440,ERROR,"\"failed: expected \" \"(123) == (reader[i])\", 123, reader[i]",
                 (char (*) [38])"failed: expected (123) == (reader[i])",(int *)local_178,
                 (uchar *)((long)&(pBVar3->super_Arena)._vptr_Arena + lVar4));
    }
    if ((*(uchar *)((long)&(__s->super_Arena)._vptr_Arena + lVar4) != '\0') &&
       (kj::_::Debug::minSeverity < 3)) {
      auVar1._12_4_ = 0;
      auVar1._0_12_ = local_178._4_12_;
      local_178 = auVar1 << 0x20;
      kj::_::Debug::log<char_const(&)[37],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x441,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                 (char (*) [37])"failed: expected (0) == (builder[i])",(int *)local_178,
                 (uchar *)((long)&(__s->super_Arena)._vptr_Arena + lVar4));
    }
  }
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    if ((*(char *)((long)&(pBVar3->dummyLimiter).limit + lVar4 + 1) != '\0') &&
       (kj::_::Debug::minSeverity < 3)) {
      auVar2._12_4_ = 0;
      auVar2._0_12_ = local_178._4_12_;
      local_178 = auVar2 << 0x20;
      kj::_::Debug::log<char_const(&)[36],int,unsigned_char_const&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x444,ERROR,"\"failed: expected \" \"(0) == (reader[i])\", 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",(int *)local_178,
                 (uchar *)((long)&(pBVar3->dummyLimiter).limit + lVar4 + 1));
    }
  }
  RVar6 = OrphanBuilder::asDataReader(&orphan2.builder);
  if ((*RVar6.super_ArrayPtr<const_unsigned_char>.ptr != ' ') && (kj::_::Debug::minSeverity < 3)) {
    local_178._0_4_ = 0x20;
    RVar6 = OrphanBuilder::asDataReader(&orphan2.builder);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x447,ERROR,
               "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
               ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",(int *)local_178,
               RVar6.super_ArrayPtr<const_unsigned_char>.ptr);
  }
  OrphanBuilder::~OrphanBuilder(&orphan2.builder);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendDataCopy) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<Data>(17);
  auto builder = orphan.get();
  memset(builder.begin(), 123, builder.size());

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(27);

  auto reader = orphan.getReader();
  EXPECT_EQ(27, reader.size());
  EXPECT_NE(builder.begin(), reader.begin());

  for (uint i = 0; i < 17; i++) {
    EXPECT_EQ(123, reader[i]);
    EXPECT_EQ(0, builder[i]);
  }
  for (uint i = 17; i < 27; i++) {
    EXPECT_EQ(0, reader[i]);
  }

  EXPECT_EQ(32, orphan2.getReader()[0]);
}